

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Glucose::SimpSolver::cleanUpClauses(SimpSolver *this)

{
  int iVar1;
  uint32_t uVar2;
  Clause *this_00;
  uint *puVar3;
  long in_RDI;
  int j;
  int i;
  Ref in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  undefined4 local_10;
  undefined4 local_c;
  
  OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::cleanAll
            ((OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted> *)
             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  local_10 = 0;
  local_c = 0;
  while( true ) {
    iVar4 = local_c;
    iVar1 = vec<unsigned_int>::size((vec<unsigned_int> *)(in_RDI + 0x208));
    if (iVar1 <= iVar4) break;
    vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x208),local_c);
    this_00 = ClauseAllocator::operator[]
                        ((ClauseAllocator *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    uVar2 = Clause::mark(this_00);
    if (uVar2 == 0) {
      puVar3 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x208),local_c);
      in_stack_ffffffffffffffd4 = *puVar3;
      puVar3 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)(in_RDI + 0x208),local_10);
      *puVar3 = in_stack_ffffffffffffffd4;
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  vec<unsigned_int>::shrink((vec<unsigned_int> *)(in_RDI + 0x208),local_c - local_10);
  return;
}

Assistant:

void SimpSolver::cleanUpClauses()
{
    occurs.cleanAll();
    int i,j;
    for (i = j = 0; i < clauses.size(); i++)
        if (ca[clauses[i]].mark() == 0)
            clauses[j++] = clauses[i];
    clauses.shrink(i - j);
}